

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O0

void Super_TranferGatesToArray(Super_Man_t *pMan)

{
  int iVar1;
  void *pvVar2;
  char *local_30;
  ABC_PTRUINT_T Key;
  Super_Gate_t_conflict *pList;
  Super_Gate_t_conflict *pGate;
  stmm_generator *gen;
  Super_Man_t *pMan_local;
  
  gen = (stmm_generator *)pMan;
  if (pMan->pGates != (Super_Gate_t_conflict **)0x0) {
    free(pMan->pGates);
    *(undefined8 *)&gen[5].index = 0;
  }
  pvVar2 = malloc((long)*(int *)((long)&gen[7].table + 4) << 3);
  *(void **)&gen[5].index = pvVar2;
  *(undefined4 *)&gen[5].entry = 0;
  pGate = (Super_Gate_t_conflict *)stmm_init_gen(gen[6].table);
  while (iVar1 = stmm_gen((stmm_generator *)pGate,&local_30,(char **)&Key), iVar1 != 0) {
    for (pList = (Super_Gate_t_conflict *)Key; pList != (Super_Gate_t_conflict *)0x0;
        pList = pList->pNext) {
      iVar1 = *(int *)&gen[5].entry;
      *(int *)&gen[5].entry = iVar1 + 1;
      *(Super_Gate_t_conflict **)(*(long *)&gen[5].index + (long)iVar1 * 8) = pList;
    }
  }
  stmm_free_gen((stmm_generator *)pGate);
  return;
}

Assistant:

void Super_TranferGatesToArray( Super_Man_t * pMan )
{
    stmm_generator * gen;
    Super_Gate_t * pGate, * pList;
    ABC_PTRUINT_T Key;

    // put the gates fron the table into the array
    ABC_FREE( pMan->pGates );
    pMan->pGates = ABC_ALLOC( Super_Gate_t *, pMan->nAdded );
    pMan->nGates = 0;
    stmm_foreach_item( pMan->tTable, gen, (char **)&Key, (char **)&pList )
    {
        for ( pGate = pList; pGate; pGate = pGate->pNext )
            pMan->pGates[ pMan->nGates++ ] = pGate;
    }
//    assert( pMan->nGates == pMan->nAdded - pMan->nRemoved );
}